

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2.cpp
# Opt level: O1

int amrex::EB2::anon_unknown_52::comp_max_crse_level(Box cdomain,Box *domain)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = 0;
  do {
    bVar1 = Box::contains(&cdomain,domain);
    if (bVar1) goto LAB_0052abe6;
    Box::refine(&cdomain,2);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x1e);
  iVar3 = 0x1e;
LAB_0052abe6:
  bVar1 = Box::operator==(&cdomain,domain);
  iVar2 = -1;
  if (bVar1) {
    iVar2 = iVar3;
  }
  return iVar2;
}

Assistant:

static int comp_max_crse_level (Box cdomain, const Box& domain)
{
    int ilev;
    for (ilev = 0; ilev < 30; ++ilev) {
        if (cdomain.contains(domain)) break;
        cdomain.refine(2);
    }
    if (cdomain != domain) ilev = -1;
    return ilev;
}